

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O1

shared_ptr<spdlog::async_logger> __thiscall
spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>::
create<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,spdlog::color_mode&>
          (async_factory_impl<(spdlog::async_overflow_policy)0> *this,string *logger_name,
          color_mode *args)

{
  undefined8 this_00;
  int iVar1;
  registry *this_01;
  pthread_mutex_t *__mutex;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::async_logger> sVar2;
  shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_> sink;
  undefined1 local_7d;
  int local_7c;
  shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_> local_78;
  undefined1 local_68 [40];
  shared_ptr<spdlog::details::thread_pool> local_40;
  
  this_01 = details::registry::instance();
  __mutex = (pthread_mutex_t *)details::registry::tp_mutex(this_01);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    details::registry::get_tp((registry *)local_68);
    if (local_68._0_8_ == 0) {
      local_7c = 1;
      local_78.
      super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<spdlog::details::thread_pool,std::allocator<spdlog::details::thread_pool>,unsigned_long_const&,int>
                (&local_78.
                  super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(thread_pool **)&local_78,
                 (allocator<spdlog::details::thread_pool> *)&local_7d,&details::default_async_q_size
                 ,&local_7c);
      this_00 = local_68._8_8_;
      local_68._8_8_ =
           local_78.
           super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_68._0_8_ =
           local_78.
           super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_78.
      super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_78.
      super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if (local_78.
          super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.
                   super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_40.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_68._0_8_;
      local_40.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_68._8_8_ + 8) = *(_Atomic_word *)(local_68._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_68._8_8_ + 8) = *(_Atomic_word *)(local_68._8_8_ + 8) + 1;
        }
      }
      details::registry::set_tp(this_01,&local_40);
      if (local_40.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.
                   super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_78.
    super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,std::allocator<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>>,spdlog::color_mode&>
              (&local_78.
                super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(ansicolor_stderr_sink<spdlog::details::console_mutex> **)&local_78,
               (allocator<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_> *)
               &local_7c,args);
    local_7c = 0;
    *(undefined8 *)this = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<spdlog::async_logger,std::allocator<spdlog::async_logger>,std::__cxx11::string,std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>>,std::shared_ptr<spdlog::details::thread_pool>,spdlog::async_overflow_policy>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(async_logger **)this,
               (allocator<spdlog::async_logger> *)&local_7d,logger_name,&local_78,
               (shared_ptr<spdlog::details::thread_pool> *)local_68,
               (async_overflow_policy *)&local_7c);
    std::__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<spdlog::async_logger,spdlog::async_logger>
              ((__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2> *)this,
               *(async_logger **)this);
    local_68._24_8_ = *(undefined8 *)this;
    local_68._32_8_ = *(undefined8 *)(this + 8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_)->_M_use_count + 1;
      }
    }
    details::registry::initialize_logger(this_01,(shared_ptr<spdlog::logger> *)(local_68 + 0x18));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_);
    }
    if (local_78.
        super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.
                 super___shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
    pthread_mutex_unlock(__mutex);
    sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<spdlog::async_logger>)
           sVar2.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

static std::shared_ptr<async_logger> create(std::string logger_name, SinkArgs &&... args)
    {
        auto &registry_inst = details::registry::instance();

        // create global thread pool if not already exists..

        auto &mutex = registry_inst.tp_mutex();
        std::lock_guard<std::recursive_mutex> tp_lock(mutex);
        auto tp = registry_inst.get_tp();
        if (tp == nullptr)
        {
            tp = std::make_shared<details::thread_pool>(details::default_async_q_size, 1);
            registry_inst.set_tp(tp);
        }

        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<async_logger>(std::move(logger_name), std::move(sink), std::move(tp), OverflowPolicy);
        registry_inst.initialize_logger(new_logger);
        return new_logger;
    }